

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_mesh.cpp
# Opt level: O1

bool __thiscall
ON_SubDDisplayParameters::Read(ON_SubDDisplayParameters *this,ON_BinaryArchive *archive)

{
  uchar uVar1;
  unsigned_short uVar2;
  Context CVar3;
  uchar uVar4;
  undefined8 uVar5;
  uint uVar6;
  ON__UINT_PTR OVar7;
  double dVar8;
  ON_Terminator *pOVar9;
  ON_ProgressReporter *pOVar10;
  double dVar11;
  undefined8 uVar12;
  undefined8 uVar13;
  bool bVar14;
  ON_SubDComponentLocation OVar15;
  bool bVar16;
  byte bVar17;
  bool bComputeCurvature;
  bool bDisplayDensityIsAbsolute;
  int chunk_version;
  uint display_density;
  uint loc_as_unsigned;
  bool local_26;
  bool local_25;
  int local_24;
  uint local_20;
  uint local_1c;
  
  dVar11 = Default.m_progress_reporter_interval.m_t[1];
  pOVar10 = Default.m_progress_reporter;
  pOVar9 = Default.m_terminator;
  dVar8 = Default.m_reserved7;
  OVar7 = Default.m_reserved6;
  uVar5 = Default._8_8_;
  uVar13 = Default._0_8_;
  (this->m_progress_reporter_interval).m_t[0] = Default.m_progress_reporter_interval.m_t[0];
  (this->m_progress_reporter_interval).m_t[1] = dVar11;
  this->m_terminator = pOVar9;
  this->m_progress_reporter = pOVar10;
  this->m_reserved6 = OVar7;
  this->m_reserved7 = dVar8;
  uVar12 = Default._0_8_;
  Default.m_bDisplayDensityIsAbsolute = SUB81(uVar13,0);
  Default.m_display_density = SUB81(uVar13,1);
  uVar1 = Default.m_display_density;
  Default.m_reserved = SUB82(uVar13,2);
  uVar2 = Default.m_reserved;
  Default.m_bControlNetMesh = SUB81(uVar13,4);
  bVar14 = Default.m_bControlNetMesh;
  Default.m_context = SUB81(uVar13,5);
  CVar3 = Default.m_context;
  Default.m_bComputeCurvature = SUB81(uVar13,6);
  bVar16 = Default.m_bComputeCurvature;
  Default.m_reserved3 = SUB81(uVar13,7);
  uVar4 = Default.m_reserved3;
  this->m_bDisplayDensityIsAbsolute = Default.m_bDisplayDensityIsAbsolute;
  Default._0_8_ = uVar12;
  uVar13 = Default._8_8_;
  this->m_display_density = uVar1;
  this->m_reserved = uVar2;
  this->m_bControlNetMesh = bVar14;
  this->m_context = CVar3;
  this->m_bComputeCurvature = bVar16;
  this->m_reserved3 = uVar4;
  Default.m_reserved4 = (uint)uVar5;
  Default.m_reserved5 = SUB84(uVar5,4);
  uVar6 = Default.m_reserved5;
  this->m_reserved4 = Default.m_reserved4;
  Default._8_8_ = uVar13;
  this->m_reserved5 = uVar6;
  local_24 = 0;
  bVar14 = ON_BinaryArchive::BeginRead3dmAnonymousChunk(archive,&local_24);
  if (!bVar14) {
    return false;
  }
  if (0 < local_24) {
    local_20 = DisplayDensity(this,&ON_SubD::Empty);
    bVar14 = ON_BinaryArchive::ReadInt(archive,&local_20);
    if (bVar14) {
      SetAdaptiveDisplayDensity(this,local_20);
      OVar15 = MeshLocation(this);
      local_1c = (uint)OVar15;
      bVar14 = ON_BinaryArchive::ReadInt(archive,&local_1c);
      if (bVar14) {
        OVar15 = ON_SubDComponentLocationFromUnsigned(local_1c);
        SetMeshLocation(this,OVar15);
        if (1 < local_24) {
          local_25 = false;
          bVar16 = ON_BinaryArchive::ReadBool(archive,&local_25);
          bVar14 = true;
          if (bVar16) {
            if (local_25 == true) {
              SetAbsoluteDisplayDensity(this,local_20);
            }
            if (2 < local_24) {
              local_26 = false;
              bVar16 = ON_BinaryArchive::ReadBool(archive,&local_26);
              bVar14 = true;
              if (!bVar16) goto LAB_0050f472;
              SetComputeCurvature(this,local_26);
            }
            bVar14 = false;
          }
LAB_0050f472:
          if (bVar14) goto LAB_0050f476;
        }
        bVar17 = 1;
        goto LAB_0050f478;
      }
    }
  }
LAB_0050f476:
  bVar17 = 0;
LAB_0050f478:
  bVar14 = ON_BinaryArchive::EndRead3dmChunk(archive);
  return (bool)(bVar14 & bVar17);
}

Assistant:

bool ON_SubDDisplayParameters::Read(class ON_BinaryArchive& archive)
{
  *this = ON_SubDDisplayParameters::Default;
  int chunk_version = 0;
  if (false == archive.BeginRead3dmAnonymousChunk(&chunk_version))
    return false;
  bool rc = false;
  for (;;)
  {
    if (chunk_version <= 0)
      break;

    unsigned int display_density = this->DisplayDensity(ON_SubD::Empty);
    if (false == archive.ReadInt(&display_density))
      break;
    SetAdaptiveDisplayDensity(display_density);

    unsigned int loc_as_unsigned = static_cast<unsigned char>(this->MeshLocation());
    if (false == archive.ReadInt(&loc_as_unsigned))
      break;
    const ON_SubDComponentLocation loc = ON_SubDComponentLocationFromUnsigned(loc_as_unsigned);
    SetMeshLocation(loc);

    if (chunk_version >= 2)
    {
      bool bDisplayDensityIsAbsolute = false;
      if (false == archive.ReadBool(&bDisplayDensityIsAbsolute))
        break;
      if (bDisplayDensityIsAbsolute)
        this->SetAbsoluteDisplayDensity(display_density);

      if (chunk_version >= 3)
      {
        bool bComputeCurvature = false;
        if (false == archive.ReadBool(&bComputeCurvature))
          break;
        this->SetComputeCurvature(bComputeCurvature);
      }
    }

    rc = true;
    break;
  }
  if (false == archive.EndRead3dmChunk())
    rc = false;
  return rc;
}